

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O1

int32 gauden_mean_reload(gauden_t *g,char *meanfile)

{
  uint uVar1;
  char *fmt;
  long ln;
  ulong uVar2;
  int32 d;
  int32 f;
  int32 *flen;
  int32 m;
  int local_28;
  uint local_24;
  int32 *local_20;
  int local_14;
  
  if (g->mean == (vector_t ***)0x0) {
    __assert_fail("g->mean != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                  ,0x1c3,"int32 gauden_mean_reload(gauden_t *, const char *)");
  }
  gauden_param_read(&g->mean,&local_14,(int32 *)&local_24,&local_28,&local_20,meanfile);
  if (local_14 == g->n_mgau) {
    uVar1 = g->n_feat;
    if ((local_24 == uVar1) && (local_28 == g->n_density)) {
      if (0 < (int)uVar1) {
        uVar2 = 0;
        do {
          if (g->featlen[uVar2] != local_20[uVar2]) {
            fmt = "Feature lengths for original and new means differ\n";
            ln = 0x1cd;
            goto LAB_00117915;
          }
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
      }
      ckd_free(local_20);
      return 0;
    }
  }
  fmt = "Mixture-gaussians dimensions for original and new means differ\n";
  ln = 0x1ca;
LAB_00117915:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
          ,ln,fmt);
  exit(1);
}

Assistant:

int32
gauden_mean_reload(gauden_t * g, const char *meanfile)
{
    int32 i, m, f, d, *flen;

    assert(g->mean != NULL);

    gauden_param_read(&(g->mean), &m, &f, &d, &flen, meanfile);

    /* Verify original and new mean parameter dimensions */
    if ((m != g->n_mgau) || (f != g->n_feat) || (d != g->n_density))
        E_FATAL
            ("Mixture-gaussians dimensions for original and new means differ\n");
    for (i = 0; i < g->n_feat; i++)
        if (g->featlen[i] != flen[i])
            E_FATAL("Feature lengths for original and new means differ\n");
    ckd_free(flen);

    return 0;
}